

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O2

void setpath(lua_State *L,char *fieldname,char *envname,char *dft)

{
  int iVar1;
  char *pcVar2;
  char *__haystack;
  char *pcVar3;
  size_t sVar4;
  luaL_Buffer b;
  
  pcVar2 = lua_pushfstring(L,"%s%s",envname,"_5_4");
  __haystack = getenv(pcVar2);
  pcVar2 = dft;
  if ((__haystack != (char *)0x0) || (__haystack = getenv(envname), __haystack != (char *)0x0)) {
    lua_getfield(L,-0xf4628,"LUA_NOENV");
    iVar1 = lua_toboolean(L,-1);
    lua_settop(L,-2);
    if ((iVar1 == 0) &&
       (pcVar3 = strstr(__haystack,";;"), pcVar2 = __haystack, pcVar3 != (char *)0x0)) {
      sVar4 = strlen(__haystack);
      luaL_buffinit(L,&b);
      if (__haystack < pcVar3) {
        luaL_addlstring(&b,__haystack,(long)pcVar3 - (long)__haystack);
        if (b.size <= b.n) {
          luaL_prepbuffsize(&b,1);
        }
        b.b[b.n] = ';';
        b.n = b.n + 1;
      }
      luaL_addstring(&b,dft);
      if (pcVar3 < __haystack + (sVar4 - 2)) {
        if (b.size <= b.n) {
          luaL_prepbuffsize(&b,1);
        }
        b.b[b.n] = ';';
        b.n = b.n + 1;
        luaL_addlstring(&b,pcVar3 + 2,(long)(__haystack + (sVar4 - 2)) - (long)pcVar3);
      }
      luaL_pushresult(&b);
      goto LAB_0012a5d4;
    }
  }
  lua_pushstring(L,pcVar2);
LAB_0012a5d4:
  lua_setfield(L,-3,fieldname);
  lua_settop(L,-2);
  return;
}

Assistant:

static void setpath (lua_State *L, const char *fieldname,
                                   const char *envname,
                                   const char *dft) {
  const char *dftmark;
  const char *nver = lua_pushfstring(L, "%s%s", envname, LUA_VERSUFFIX);
  const char *path = getenv(nver);  /* try versioned name */
  if (path == NULL)  /* no versioned environment variable? */
    path = getenv(envname);  /* try unversioned name */
  if (path == NULL || noenv(L))  /* no environment variable? */
    lua_pushstring(L, dft);  /* use default */
  else if ((dftmark = strstr(path, LUA_PATH_SEP LUA_PATH_SEP)) == NULL)
    lua_pushstring(L, path);  /* nothing to change */
  else {  /* path contains a ";;": insert default path in its place */
    size_t len = strlen(path);
    luaL_Buffer b;
    luaL_buffinit(L, &b);
    if (path < dftmark) {  /* is there a prefix before ';;'? */
      luaL_addlstring(&b, path, dftmark - path);  /* add it */
      luaL_addchar(&b, *LUA_PATH_SEP);
    }
    luaL_addstring(&b, dft);  /* add default */
    if (dftmark < path + len - 2) {  /* is there a suffix after ';;'? */
      luaL_addchar(&b, *LUA_PATH_SEP);
      luaL_addlstring(&b, dftmark + 2, (path + len - 2) - dftmark);
    }
    luaL_pushresult(&b);
  }
  setprogdir(L);
  lua_setfield(L, -3, fieldname);  /* package[fieldname] = path value */
  lua_pop(L, 1);  /* pop versioned variable name ('nver') */
}